

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_face_only
          (REF_INTERP ref_interp,REF_INT faceid,REF_INT leading_dim,REF_DBL *from_scalar,
          REF_DBL *to_scalar)

{
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_MPI ref_mpi_00;
  REF_CELL ref_cell;
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tries;
  REF_BOOL increase_fuzz;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_INT *recept_cell;
  REF_INT *recept_node;
  REF_INT *recept_ret;
  REF_INT *recept_proc;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_bary;
  REF_DBL *donor_scalar;
  REF_DBL *recept_scalar;
  REF_INT n_donor;
  REF_INT donation;
  REF_INT n_recept;
  REF_INT receptor;
  REF_INT nodes [27];
  REF_INT im;
  REF_INT ibary;
  REF_INT node;
  REF_CELL from_cell;
  REF_MPI ref_mpi;
  REF_NODE to_node;
  REF_GRID to_grid;
  REF_DBL *to_scalar_local;
  REF_DBL *from_scalar_local;
  REF_INT leading_dim_local;
  REF_INT faceid_local;
  REF_INTERP ref_interp_local;
  
  ref_grid = ref_interp->to_grid;
  ref_node = ref_grid->node;
  ref_mpi_00 = ref_grid->mpi;
  ref_cell = ref_interp->from_tet;
  ref_interp_local._4_4_ =
       ref_grid_compact_surf_id_nodes
                 (ref_grid,faceid,(REF_GLOB *)&l2c,(REF_LONG *)&tries,(REF_GLOB **)&ncell);
  if (ref_interp_local._4_4_ == 0) {
    for (im = 0; im < ref_node->max; im = im + 1) {
      if ((((-1 < im) && (im < ref_node->max)) && (-1 < ref_node->global[im])) &&
         ((*(long *)(ncell + (long)im * 8) == -1 || (ref_node->ref_mpi->id != ref_node->part[im]))))
      {
        ref_interp->cell[im] = -0x39;
      }
    }
    ref_private_macro_code_rss = 0;
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 0xc;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      if ((ref_private_macro_code_rss != 0) &&
         (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi_00->id == 0)) {
        printf("retry tree search with %e fuzz\n",ref_interp->search_fuzz);
      }
      uVar1 = ref_interp_tree(ref_interp,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x8b0,"ref_interp_face_only",(ulong)uVar1,"tree");
        return uVar1;
      }
      if ((ref_interp->instrument != 0) &&
         (uVar1 = ref_mpi_stopwatch_stop(ref_mpi_00,"tree"), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x8b2,"ref_interp_face_only",(ulong)uVar1,"locate clock");
        return uVar1;
      }
      if (ref_private_macro_code_rss == 0) break;
    }
    if ((long)ref_private_macro_code_rss == 0) {
      for (im = 0; im < ref_node->max; im = im + 1) {
        if ((((-1 < im) && (im < ref_node->max)) && (-1 < ref_node->global[im])) &&
           ((*(long *)(ncell + (long)im * 8) == -1 || (ref_node->ref_mpi->id != ref_node->part[im]))
           )) {
          ref_interp->cell[im] = -1;
        }
      }
      n_donor = 0;
      for (im = 0; im < ref_node->max; im = im + 1) {
        if (((-1 < im) && (im < ref_node->max)) &&
           ((-1 < ref_node->global[im] &&
            ((*(long *)(ncell + (long)im * 8) != -1 && (ref_node->ref_mpi->id == ref_node->part[im])
             ))))) {
          n_donor = n_donor + 1;
        }
      }
      if (n_donor * 4 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x8c4,"ref_interp_face_only","malloc recept_bary of REF_DBL negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        donor_bary = (REF_DBL *)malloc((long)(n_donor << 2) << 3);
        if (donor_bary == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x8c4,"ref_interp_face_only","malloc recept_bary of REF_DBL NULL");
          ref_interp_local._4_4_ = 2;
        }
        else if (n_donor < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x8c5,"ref_interp_face_only","malloc recept_cell of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          nnode = (REF_GLOB)malloc((long)n_donor << 2);
          if ((void *)nnode == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x8c5,"ref_interp_face_only","malloc recept_cell of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else if (n_donor < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x8c6,"ref_interp_face_only","malloc recept_node of REF_INT negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            recept_cell = (REF_INT *)malloc((long)n_donor << 2);
            if (recept_cell == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x8c6,"ref_interp_face_only","malloc recept_node of REF_INT NULL");
              ref_interp_local._4_4_ = 2;
            }
            else if (n_donor < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x8c7,"ref_interp_face_only","malloc recept_ret of REF_INT negative");
              ref_interp_local._4_4_ = 1;
            }
            else {
              recept_node = (REF_INT *)malloc((long)n_donor << 2);
              if (recept_node == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8c7,"ref_interp_face_only","malloc recept_ret of REF_INT NULL");
                ref_interp_local._4_4_ = 2;
              }
              else if (n_donor < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x8c8,"ref_interp_face_only","malloc recept_proc of REF_INT negative");
                ref_interp_local._4_4_ = 1;
              }
              else {
                recept_ret = (REF_INT *)malloc((long)n_donor << 2);
                if (recept_ret == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x8c8,"ref_interp_face_only","malloc recept_proc of REF_INT NULL");
                  ref_interp_local._4_4_ = 2;
                }
                else {
                  n_donor = 0;
                  for (im = 0; im < ref_node->max; im = im + 1) {
                    if ((((-1 < im) && (im < ref_node->max)) && (-1 < ref_node->global[im])) &&
                       ((*(long *)(ncell + (long)im * 8) != -1 &&
                        (ref_node->ref_mpi->id == ref_node->part[im])))) {
                      if (ref_interp->cell[im] == -1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x8cd,"ref_interp_face_only","node needs to be localized");
                        return 1;
                      }
                      uVar1 = ref_node_clip_bary4(ref_interp->bary + (im << 2),
                                                  donor_bary + (n_donor << 2));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x8d0,"ref_interp_face_only",(ulong)uVar1,"clip");
                        return uVar1;
                      }
                      recept_ret[n_donor] = ref_interp->part[im];
                      *(REF_INT *)(nnode + (long)n_donor * 4) = ref_interp->cell[im];
                      recept_cell[n_donor] = im;
                      recept_node[n_donor] = ref_mpi_00->id;
                      n_donor = n_donor + 1;
                    }
                  }
                  if (ncell != 0) {
                    free((void *)ncell);
                  }
                  ref_interp_local._4_4_ =
                       ref_mpi_blindsend(ref_mpi_00,recept_ret,(void *)nnode,1,n_donor,&recept_proc,
                                         (REF_INT *)&recept_scalar,1);
                  if (ref_interp_local._4_4_ == 0) {
                    ref_interp_local._4_4_ =
                         ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_node,1,n_donor,&donor_cell,
                                           (REF_INT *)&recept_scalar,1);
                    if (ref_interp_local._4_4_ == 0) {
                      ref_interp_local._4_4_ =
                           ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_cell,1,n_donor,&donor_ret,
                                             (REF_INT *)&recept_scalar,1);
                      if (ref_interp_local._4_4_ == 0) {
                        ref_interp_local._4_4_ =
                             ref_mpi_blindsend(ref_mpi_00,recept_ret,donor_bary,4,n_donor,
                                               &donor_node,(REF_INT *)&recept_scalar,3);
                        if (ref_interp_local._4_4_ == 0) {
                          if (recept_ret != (REF_INT *)0x0) {
                            free(recept_ret);
                          }
                          if (recept_node != (REF_INT *)0x0) {
                            free(recept_node);
                          }
                          if (recept_cell != (REF_INT *)0x0) {
                            free(recept_cell);
                          }
                          if (nnode != 0) {
                            free((void *)nnode);
                          }
                          if (donor_bary != (REF_DBL *)0x0) {
                            free(donor_bary);
                          }
                          if (leading_dim * (int)recept_scalar < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x8ee,"ref_interp_face_only",
                                   "malloc donor_scalar of REF_DBL negative");
                            ref_interp_local._4_4_ = 1;
                          }
                          else {
                            recept_bary = (REF_DBL *)
                                          malloc((long)(leading_dim * (int)recept_scalar) << 3);
                            if (recept_bary == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x8ee,"ref_interp_face_only",
                                     "malloc donor_scalar of REF_DBL NULL");
                              ref_interp_local._4_4_ = 2;
                            }
                            else {
                              for (recept_scalar._4_4_ = 0; recept_scalar._4_4_ < (int)recept_scalar
                                  ; recept_scalar._4_4_ = recept_scalar._4_4_ + 1) {
                                uVar1 = ref_cell_nodes(ref_cell,recept_proc[recept_scalar._4_4_],
                                                       &n_recept);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x8f2,"ref_interp_face_only",(ulong)uVar1,
                                         "node needs to be localized");
                                  return uVar1;
                                }
                                for (nodes[0x19] = 0; nodes[0x19] < leading_dim;
                                    nodes[0x19] = nodes[0x19] + 1) {
                                  recept_bary[nodes[0x19] + leading_dim * recept_scalar._4_4_] = 0.0
                                  ;
                                  for (nodes[0x1a] = 0; nodes[0x1a] < 4;
                                      nodes[0x1a] = nodes[0x1a] + 1) {
                                    iVar2 = nodes[0x19] + leading_dim * recept_scalar._4_4_;
                                    recept_bary[iVar2] =
                                         *(double *)
                                          (donor_node +
                                          (long)(nodes[0x1a] + recept_scalar._4_4_ * 4) * 2) *
                                         from_scalar
                                         [nodes[0x19] + leading_dim * (&n_recept)[nodes[0x1a]]] +
                                         recept_bary[iVar2];
                                  }
                                }
                              }
                              if (recept_proc != (REF_INT *)0x0) {
                                free(recept_proc);
                              }
                              if (donor_node != (REF_INT *)0x0) {
                                free(donor_node);
                              }
                              ref_interp_local._4_4_ =
                                   ref_mpi_blindsend(ref_mpi_00,donor_cell,recept_bary,leading_dim,
                                                     (int)recept_scalar,&donor_scalar,&n_donor,3);
                              if (ref_interp_local._4_4_ == 0) {
                                ref_interp_local._4_4_ =
                                     ref_mpi_blindsend(ref_mpi_00,donor_cell,donor_ret,1,
                                                       (int)recept_scalar,&recept_cell,&n_donor,1);
                                if (ref_interp_local._4_4_ == 0) {
                                  if (recept_bary != (REF_DBL *)0x0) {
                                    free(recept_bary);
                                  }
                                  if (donor_ret != (REF_INT *)0x0) {
                                    free(donor_ret);
                                  }
                                  if (donor_cell != (REF_INT *)0x0) {
                                    free(donor_cell);
                                  }
                                  for (donation = 0; donation < n_donor; donation = donation + 1) {
                                    iVar2 = recept_cell[donation];
                                    for (nodes[0x19] = 0; nodes[0x19] < leading_dim;
                                        nodes[0x19] = nodes[0x19] + 1) {
                                      to_scalar[nodes[0x19] + leading_dim * iVar2] =
                                           donor_scalar[nodes[0x19] + leading_dim * donation];
                                    }
                                  }
                                  if (recept_cell != (REF_INT *)0x0) {
                                    free(recept_cell);
                                  }
                                  if (donor_scalar != (REF_DBL *)0x0) {
                                    free(donor_scalar);
                                  }
                                  ref_interp_local._4_4_ =
                                       ref_node_ghost_dbl(ref_node,to_scalar,leading_dim);
                                  if (ref_interp_local._4_4_ == 0) {
                                    ref_interp_local._4_4_ = 0;
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x915,"ref_interp_face_only",
                                           (ulong)ref_interp_local._4_4_,"ghost");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x905,"ref_interp_face_only",(ulong)ref_interp_local._4_4_
                                         ,"blind send node");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x902,"ref_interp_face_only",(ulong)ref_interp_local._4_4_,
                                       "blind send bary");
                              }
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x8e6,"ref_interp_face_only",(ulong)ref_interp_local._4_4_,
                                 "blind send bary");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x8e3,"ref_interp_face_only",(ulong)ref_interp_local._4_4_,
                               "blind send node");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x8e0,"ref_interp_face_only",(ulong)ref_interp_local._4_4_,
                             "blind send ret");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x8dd,"ref_interp_face_only",(ulong)ref_interp_local._4_4_,
                           "blind send cell");
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x8b5,"ref_interp_face_only","unable to grow fuzz to find tree candidate",0,
             (long)ref_private_macro_code_rss);
      ref_interp_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x8a0,
           "ref_interp_face_only",(ulong)ref_interp_local._4_4_,"l2c");
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_face_only(REF_INTERP ref_interp, REF_INT faceid,
                                        REF_INT leading_dim,
                                        REF_DBL *from_scalar,
                                        REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell = ref_interp_from_tet(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_BOOL increase_fuzz;
  REF_INT tries;

  RSS(ref_grid_compact_surf_id_nodes(to_grid, faceid, &nnode, &ncell, &l2c),
      "l2c");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = -57; /* magic number to skip */
    }
  }

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY == l2c[node] || !ref_node_owned(to_node, node)) {
      ref_interp->cell[node] = REF_EMPTY; /* set back */
    }
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (REF_EMPTY != l2c[node] && ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  ref_free(l2c);

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");

  return REF_SUCCESS;
}